

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

int Gia_ManRealizeFormula_rec(Gia_Man_t *p,int *pVars,int *pPars,char *pBeg,char *pEnd,int nPars)

{
  byte bVar1;
  int iVar2;
  int iLit1;
  int iData0;
  uint uVar3;
  byte *pbVar4;
  char *pEnd_00;
  char *pcVar5;
  byte *pForm;
  
  if (pBeg + 1 != pEnd) {
    pcVar5 = pEnd + -1;
    pForm = (byte *)pBeg;
    do {
      if ((*pForm != 0x28) ||
         (pbVar4 = (byte *)Gia_ManFormulaEndToken((char *)pForm), (byte *)pEnd != pbVar4)) {
        pbVar4 = (byte *)Gia_ManFormulaEndToken((char *)pForm);
        iVar2 = Gia_ManRealizeFormula_rec(p,pVars,pPars,(char *)pForm,(char *)pbVar4,nPars);
        bVar1 = *pbVar4;
        pcVar5 = Gia_ManFormulaEndToken((char *)(pbVar4 + 1));
        iLit1 = Gia_ManRealizeFormula_rec(p,pVars,pPars,(char *)(pbVar4 + 1),pcVar5,nPars);
        if (bVar1 < 0x5e) {
          if (bVar1 == 0x26) {
            iVar2 = Gia_ManHashAnd(p,iVar2,iLit1);
            return iVar2;
          }
          if (bVar1 == 0x3f) {
            if (*pcVar5 == ':') {
              pEnd_00 = Gia_ManFormulaEndToken(pcVar5 + 1);
              iData0 = Gia_ManRealizeFormula_rec(p,pVars,pPars,pcVar5 + 1,pEnd_00,nPars);
              iVar2 = Gia_ManHashMux(p,iVar2,iLit1,iData0);
              return iVar2;
            }
            __assert_fail("pEndNew[0] == \':\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                          ,0x33b,
                          "int Gia_ManRealizeFormula_rec(Gia_Man_t *, int *, int *, char *, char *, int)"
                         );
          }
        }
        else {
          if (bVar1 == 0x5e) {
            iVar2 = Gia_ManHashXor(p,iVar2,iLit1);
            return iVar2;
          }
          if (bVar1 == 0x7c) {
            iVar2 = Gia_ManHashOr(p,iVar2,iLit1);
            return iVar2;
          }
        }
        __assert_fail("Oper == \'?\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                      ,0x33a,
                      "int Gia_ManRealizeFormula_rec(Gia_Man_t *, int *, int *, char *, char *, int)"
                     );
      }
      if (*pForm != 0x28) {
        __assert_fail("pBeg[0] == \'(\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                      ,0x325,
                      "int Gia_ManRealizeFormula_rec(Gia_Man_t *, int *, int *, char *, char *, int)"
                     );
      }
      if (*pcVar5 != ')') {
        __assert_fail("pBeg[pEnd-pBeg-1] == \')\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                      ,0x326,
                      "int Gia_ManRealizeFormula_rec(Gia_Man_t *, int *, int *, char *, char *, int)"
                     );
      }
      pEnd = (char *)((byte *)pEnd + -1);
      pBeg = (char *)(pForm + 1);
      pbVar4 = pForm + 2;
      pcVar5 = pcVar5 + -1;
      pForm = (byte *)pBeg;
    } while ((byte *)pEnd != pbVar4);
  }
  bVar1 = *pBeg;
  if ((byte)(bVar1 + 0x9f) < 2) {
    uVar3 = pVars[(ulong)bVar1 - 0x61];
  }
  else {
    if ((byte)(bVar1 + 0xbf) < 2) {
      uVar3 = pVars[(ulong)bVar1 - 0x41];
    }
    else {
      if ((bVar1 & 0xf8) != 0x50) {
        if ((bVar1 & 0xf8) == 0x70) {
          return pPars[(ulong)bVar1 - 0x70];
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                      ,0x31d,
                      "int Gia_ManRealizeFormula_rec(Gia_Man_t *, int *, int *, char *, char *, int)"
                     );
      }
      uVar3 = pPars[(ulong)bVar1 - 0x50];
    }
    if ((int)uVar3 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    uVar3 = uVar3 ^ 1;
  }
  return uVar3;
}

Assistant:

int Gia_ManRealizeFormula_rec( Gia_Man_t * p, int * pVars, int * pPars, char * pBeg, char * pEnd, int nPars )
{
    int iFans[3], Oper = -1;
    char * pEndNew;
    if ( pBeg + 1 == pEnd )
    {
        if ( pBeg[0] >= 'a' && pBeg[0] <= 'b' )
            return pVars[pBeg[0] - 'a'];
        if ( pBeg[0] >= 'A' && pBeg[0] <= 'B' )
            return Abc_LitNot( pVars[pBeg[0] - 'A'] );
        if ( pBeg[0] >= 'p' && pBeg[0] <= 'w' ) // pqrstuvw
            return pPars[pBeg[0] - 'p'];
        if ( pBeg[0] >= 'P' && pBeg[0] <= 'W' )
            return Abc_LitNot( pPars[pBeg[0] - 'P'] );
        assert( 0 );
        return -1;
    }
    if ( pBeg[0] == '(' )
    {
        pEndNew = Gia_ManFormulaEndToken( pBeg );
        if ( pEndNew == pEnd )
        {
            assert( pBeg[0] == '(' );
            assert( pBeg[pEnd-pBeg-1] == ')' );
            return Gia_ManRealizeFormula_rec( p, pVars, pPars, pBeg + 1, pEnd - 1, nPars );
        }
    }
    // get first part
    pEndNew  = Gia_ManFormulaEndToken( pBeg );
    iFans[0] = Gia_ManRealizeFormula_rec( p, pVars, pPars, pBeg, pEndNew, nPars );
    Oper     = pEndNew[0];
    // get second part
    pBeg     = pEndNew + 1;
    pEndNew  = Gia_ManFormulaEndToken( pBeg );
    iFans[1] = Gia_ManRealizeFormula_rec( p, pVars, pPars, pBeg, pEndNew, nPars );
    // derive the formula
    if ( Oper == '&' )
        return Gia_ManHashAnd( p, iFans[0], iFans[1] );
    if ( Oper == '|' )
        return Gia_ManHashOr( p, iFans[0], iFans[1] );
    if ( Oper == '^' )
        return Gia_ManHashXor( p, iFans[0], iFans[1] );
    // get third part
    assert( Oper == '?' );
    assert( pEndNew[0] == ':' );
    pBeg     = pEndNew + 1;
    pEndNew  = Gia_ManFormulaEndToken( pBeg );
    iFans[2] = Gia_ManRealizeFormula_rec( p, pVars, pPars, pBeg, pEndNew, nPars );
    return Gia_ManHashMux( p, iFans[0], iFans[1], iFans[2] );
}